

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O3

void telemetry_messenger_destroy(TELEMETRY_MESSENGER_HANDLE messenger_handle)

{
  LIST_ITEM_HANDLE pLVar1;
  MESSENGER_SEND_EVENT_TASK *task;
  undefined8 *__ptr;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  TELEMETRY_MESSENGER_INSTANCE_conflict *instance;
  TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT send_result;
  undefined4 local_2c;
  
  if (messenger_handle == (TELEMETRY_MESSENGER_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                 ,"telemetry_messenger_destroy",0x727,1,
                 "telemetry_messenger_destroy failed (messenger_handle is NULL)");
      return;
    }
  }
  else {
    if (messenger_handle->state != TELEMETRY_MESSENGER_STATE_STOPPED) {
      telemetry_messenger_stop(messenger_handle);
    }
    pLVar1 = singlylinkedlist_get_head_item(messenger_handle->in_progress_list);
    if (pLVar1 != (LIST_ITEM_HANDLE)0x0) {
      do {
        task = (MESSENGER_SEND_EVENT_TASK *)singlylinkedlist_item_get_value(pLVar1);
        singlylinkedlist_remove(messenger_handle->in_progress_list,pLVar1);
        if (task != (MESSENGER_SEND_EVENT_TASK *)0x0) {
          local_2c = 3;
          singlylinkedlist_foreach(task->callback_list,invoke_callback,&local_2c);
          free_task(task);
        }
        pLVar1 = singlylinkedlist_get_head_item(messenger_handle->in_progress_list);
      } while (pLVar1 != (LIST_ITEM_HANDLE)0x0);
    }
    pLVar1 = singlylinkedlist_get_head_item(messenger_handle->waiting_to_send);
    while (pLVar1 != (LIST_ITEM_HANDLE)0x0) {
      __ptr = (undefined8 *)singlylinkedlist_item_get_value(pLVar1);
      singlylinkedlist_remove(messenger_handle->waiting_to_send,pLVar1);
      if (__ptr != (undefined8 *)0x0) {
        (*(code *)__ptr[1])(*__ptr,4,__ptr[2]);
        free(__ptr);
      }
      pLVar1 = singlylinkedlist_get_head_item(messenger_handle->waiting_to_send);
    }
    singlylinkedlist_destroy(messenger_handle->waiting_to_send);
    singlylinkedlist_destroy(messenger_handle->in_progress_list);
    STRING_delete(messenger_handle->iothub_host_fqdn);
    STRING_delete(messenger_handle->device_id);
    STRING_delete(messenger_handle->module_id);
    free(messenger_handle);
  }
  return;
}

Assistant:

void telemetry_messenger_destroy(TELEMETRY_MESSENGER_HANDLE messenger_handle)
{
    if (messenger_handle == NULL)
    {
        LogError("telemetry_messenger_destroy failed (messenger_handle is NULL)");
    }
    else
    {
        LIST_ITEM_HANDLE list_node;
        TELEMETRY_MESSENGER_INSTANCE* instance = (TELEMETRY_MESSENGER_INSTANCE*)messenger_handle;

        if (instance->state != TELEMETRY_MESSENGER_STATE_STOPPED)
        {
            (void)telemetry_messenger_stop(messenger_handle);
        }


        // Note: yes telemetry_messenger_stop() tried to move all events from in_progress_list to wait_to_send_list,
        //       but we need to iterate through in case any events failed to be moved.
        while ((list_node = singlylinkedlist_get_head_item(instance->in_progress_list)) != NULL)
        {
            MESSENGER_SEND_EVENT_TASK* task = (MESSENGER_SEND_EVENT_TASK*)singlylinkedlist_item_get_value(list_node);

            (void)singlylinkedlist_remove(instance->in_progress_list, list_node);

            if (task != NULL)
            {
                TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT send_result = TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_TIMEOUT;
                singlylinkedlist_foreach(task->callback_list, invoke_callback, (void*)&send_result);
                free_task(task);
            }
        }

        while ((list_node = singlylinkedlist_get_head_item(instance->waiting_to_send)) != NULL)
        {
            MESSENGER_SEND_EVENT_CALLER_INFORMATION* caller_info = (MESSENGER_SEND_EVENT_CALLER_INFORMATION*)singlylinkedlist_item_get_value(list_node);

            (void)singlylinkedlist_remove(instance->waiting_to_send, list_node);

            if (caller_info != NULL)
            {
                caller_info->on_event_send_complete_callback(caller_info->message, TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_MESSENGER_DESTROYED, (void*)caller_info->context);
                free(caller_info);
            }
        }

        singlylinkedlist_destroy(instance->waiting_to_send);
        singlylinkedlist_destroy(instance->in_progress_list);

        STRING_delete(instance->iothub_host_fqdn);

        STRING_delete(instance->device_id);

        STRING_delete(instance->module_id);

        (void)free(instance);
    }
}